

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_floor(lua_State *L)

{
  int iVar1;
  lua_Number __x;
  double d;
  
  iVar1 = lua_isinteger(L,1);
  if (iVar1 == 0) {
    __x = luaL_checknumber(L,1);
    d = floor(__x);
    pushnumint(L,d);
  }
  else {
    lua_settop(L,1);
  }
  return 1;
}

Assistant:

static int math_floor(lua_State *L) {
    if (lua_isinteger(L, 1))
        lua_settop(L, 1);  /* integer is its own floor */
    else {
        lua_Number d = l_mathop(floor)(luaL_checknumber(L, 1));
        pushnumint(L, d);
    }
    return 1;
}